

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

void __thiscall sznet::net::TcpConnection::shutdownInLoop(TcpConnection *this)

{
  EventLoop::assertInLoopThread(this->m_loop);
  if ((((this->m_channel)._M_t.
        super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>._M_t.
        super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>.
        super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl)->m_events & 8) == 0) {
    Socket::shutdownWrite
              ((this->m_socket)._M_t.
               super___uniq_ptr_impl<sznet::net::Socket,_std::default_delete<sznet::net::Socket>_>.
               _M_t.
               super__Tuple_impl<0UL,_sznet::net::Socket_*,_std::default_delete<sznet::net::Socket>_>
               .super__Head_base<0UL,_sznet::net::Socket_*,_false>._M_head_impl);
    return;
  }
  return;
}

Assistant:

void TcpConnection::shutdownInLoop()
{
	m_loop->assertInLoopThread();
	// û��ע��д�¼��Ļ������رգ��ر�д��
	if (!m_channel->isWriting())
	{
		m_socket->shutdownWrite();
	}
}